

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

int __thiscall
glcts::SampleShadingApiCaseGroup::init(SampleShadingApiCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SampleShadingApiCase *this_00;
  SampleShadingApiCaseGroup *this_local;
  
  this_00 = (SampleShadingApiCase *)operator_new(0x88);
  SampleShadingApiCase::SampleShadingApiCase
            (this_00,(this->super_TestCaseGroup).m_context,this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(new SampleShadingApiCase(m_context, m_glslVersion));
	}